

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O2

void unroll(lua_State *L,void *ud)

{
  CallInfo *ci;
  lua_KFunction p_Var1;
  int iVar2;
  uint uVar3;
  StkId oldtop;
  CallInfo *pCVar4;
  uint uVar5;
  
  while (ci = L->ci, ci != &L->base_ci) {
    uVar3 = ci->callstatus;
    if ((short)uVar3 < 0) {
      if ((uVar3 >> 0x11 & 1) == 0) {
        p_Var1 = (ci->u).c.k;
        uVar5 = 1;
        pCVar4 = ci;
        if ((uVar3 >> 0x15 & 1) != 0) {
          if ((uVar3 & 0x7000) == 0) {
            uVar5 = 1;
          }
          else {
            iVar2 = (ci->u2).funcidx;
            L->allowhook = (byte)(uVar3 >> 0x13) & 1;
            uVar5 = uVar3 >> 0xc & 7;
            oldtop = luaF_close(L,(StkId)((long)iVar2 + (long)(L->stack).p),(TStatus)uVar5,1);
            luaD_seterrorobj(L,(TStatus)uVar5,oldtop);
            luaD_shrinkstack(L);
            uVar3 = ci->callstatus & 0xffff8fff;
            pCVar4 = L->ci;
          }
          ci->callstatus = uVar3 & 0xffdfffff;
          L->errfunc = (ci->u).c.old_errfunc;
        }
        if ((pCVar4->top).p < (L->top).p) {
          (pCVar4->top).p = (L->top).p;
        }
        iVar2 = (*p_Var1)(L,uVar5,(ci->u).c.ctx);
      }
      else {
        iVar2 = (ci->u2).funcidx;
      }
      luaD_poscall(L,ci,iVar2);
    }
    else {
      luaV_finishOp(L);
      luaV_execute(L,ci);
    }
  }
  return;
}

Assistant:

static void unroll (lua_State *L, void *ud) {
  CallInfo *ci;
  UNUSED(ud);
  while ((ci = L->ci) != &L->base_ci) {  /* something in the stack */
    if (!isLua(ci))  /* C function? */
      finishCcall(L, ci);  /* complete its execution */
    else {  /* Lua function */
      luaV_finishOp(L);  /* finish interrupted instruction */
      luaV_execute(L, ci);  /* execute down to higher C 'boundary' */
    }
  }
}